

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

hugeint_t duckdb::FactorialOperator::Operation<int,duckdb::hugeint_t>(int left)

{
  hugeint_t left_00;
  bool bVar1;
  OutOfRangeException *this;
  ulong value;
  hugeint_t ret;
  hugeint_t local_70;
  hugeint_t local_60;
  string local_50;
  
  hugeint_t::hugeint_t(&local_70,1);
  if (1 < left) {
    value = 2;
    do {
      left_00 = local_70;
      hugeint_t::hugeint_t(&local_60,value);
      bVar1 = TryMultiplyOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (left_00,local_60,&local_70);
      if (!bVar1) {
        this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Value out of range","");
        OutOfRangeException::OutOfRangeException(this,&local_50);
        __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      value = value + 1;
    } while (left + 1 != value);
  }
  return local_70;
}

Assistant:

static inline TR Operation(TA left) {
		TR ret = 1;
		for (TA i = 2; i <= left; i++) {
			if (!TryMultiplyOperator::Operation(ret, TR(i), ret)) {
				throw OutOfRangeException("Value out of range");
			}
		}
		return ret;
	}